

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

bool kratos::is_reduction_op(ExprOp op)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  __hash_code __code;
  __node_base_ptr p_Var3;
  __node_base_ptr p_Var4;
  bool bVar5;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 local_18 [5];
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  
  if ((is_reduction_op(kratos::ExprOp)::ops == '\0') &&
     (iVar2 = __cxa_guard_acquire(&is_reduction_op(kratos::ExprOp)::ops), iVar2 != 0)) {
    local_28 = 5;
    uStack_20 = 4;
    local_38 = 3;
    uStack_34 = 0;
    uStack_30 = 6;
    uStack_2c = 0;
    std::
    _Hashtable<kratos::ExprOp,kratos::ExprOp,std::allocator<kratos::ExprOp>,std::__detail::_Identity,std::equal_to<kratos::ExprOp>,std::hash<kratos::ExprOp>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<kratos::ExprOp_const*>
              ((_Hashtable<kratos::ExprOp,kratos::ExprOp,std::allocator<kratos::ExprOp>,std::__detail::_Identity,std::equal_to<kratos::ExprOp>,std::hash<kratos::ExprOp>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&is_reduction_op::ops,&local_38,local_18,0,&local_13,&local_12,&local_11);
    __cxa_atexit(std::
                 unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
                 ::~unordered_set,&is_reduction_op::ops,&__dso_handle);
    __cxa_guard_release(&is_reduction_op(kratos::ExprOp)::ops);
  }
  p_Var3 = is_reduction_op::ops._M_h._M_buckets[op % is_reduction_op::ops._M_h._M_bucket_count];
  p_Var4 = (__node_base_ptr)0x0;
  if ((p_Var3 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var3->_M_nxt, p_Var4 = p_Var3, p_Var3->_M_nxt[1]._M_nxt != (_Hash_node_base *)op))
  {
    while (p_Var3 = p_Var1, p_Var1 = p_Var3->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var4 = (__node_base_ptr)0x0;
      if (((ulong)p_Var1[1]._M_nxt % is_reduction_op::ops._M_h._M_bucket_count !=
           op % is_reduction_op::ops._M_h._M_bucket_count) ||
         (p_Var4 = p_Var3, p_Var1[1]._M_nxt == (_Hash_node_base *)op)) goto LAB_001824d4;
    }
    p_Var4 = (__node_base_ptr)0x0;
  }
LAB_001824d4:
  if (p_Var4 == (__node_base_ptr)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = p_Var4->_M_nxt != (_Hash_node_base *)0x0;
  }
  return bVar5;
}

Assistant:

bool is_reduction_op(ExprOp op) {
    static std::unordered_set<ExprOp> ops = {ExprOp::UOr, ExprOp::UXor, ExprOp::UAnd, ExprOp::UNot};
    return ops.find(op) != ops.end();
}